

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ipc::BufferedFrameDeserializer::BufferedFrameDeserializer
          (BufferedFrameDeserializer *this,size_t max_capacity)

{
  uint uVar1;
  code *pcVar2;
  uint *puVar3;
  char *pcVar4;
  char *local_28;
  
  base::PagedMemory::PagedMemory(&this->buf_);
  this->capacity_ = max_capacity;
  this->size_ = 0;
  (this->decoded_frames_).
  super__List_base<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->decoded_frames_;
  (this->decoded_frames_).
  super__List_base<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->decoded_frames_;
  (this->decoded_frames_).
  super__List_base<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
  ._M_impl._M_node._M_size = 0;
  if (base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i == 0) {
    base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)getpagesize();
  }
  if (max_capacity %
      (ulong)(uint)base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i == 0) {
    if (base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i == 0) {
      base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)getpagesize();
    }
    if ((uint)base::GetSysPageSize::page_size.super___atomic_base<unsigned_int>._M_i <= max_capacity
       ) {
      return;
    }
    ipc::BufferedFrameDeserializer((ipc *)&local_28);
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    base::LogMessage(kLogError,local_28,0x10b49,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(max_capacity >= base::GetSysPageSize())",(ulong)uVar1,pcVar4);
  }
  else {
    ipc::BufferedFrameDeserializer((ipc *)&local_28);
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    base::LogMessage(kLogError,local_28,0x10b48,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(max_capacity % base::GetSysPageSize() == 0)",(ulong)uVar1,
                     pcVar4);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BufferedFrameDeserializer::BufferedFrameDeserializer(size_t max_capacity)
    : capacity_(max_capacity) {
  PERFETTO_CHECK(max_capacity % base::GetSysPageSize() == 0);
  PERFETTO_CHECK(max_capacity >= base::GetSysPageSize());
}